

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

void hexdumpqwords<unsigned_char*>(string *str,uchar *buf,size_t nLength)

{
  uint64_t d;
  undefined1 *local_28;
  char *p;
  size_t nLength_local;
  uchar *buf_local;
  string *str_local;
  
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)str);
  std::__cxx11::string::size();
  local_28 = (undefined1 *)std::__cxx11::string::operator[]((ulong)str);
  p = (char *)nLength;
  nLength_local = (size_t)buf;
  while (p != (char *)0x0) {
    *local_28 = 0x20;
    d = get64le<unsigned_char*>((uchar *)nLength_local);
    qword2hexchars(d,local_28 + 1);
    local_28 = local_28 + 0x11;
    nLength_local = nLength_local + 8;
    p = p + -1;
  }
  return;
}

Assistant:

void hexdumpqwords(std::string &str, I buf, size_t nLength)
{
    str.resize(str.size()+nLength*17);
    char *p= &str[str.size()-nLength*17];
    while(nLength--)
    {
        *p++ = ' ';
        qword2hexchars(get64le(buf), p); p+=16; buf+=8;
    }
}